

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O3

void pinger_write_ping(pinger_t *pinger)

{
  int iVar1;
  uv_write_t *req;
  void *pvVar2;
  undefined8 *extraout_RDX;
  uint nbufs;
  anon_union_264_2_629321f6_for_stream *handle;
  char *unaff_R14;
  long lVar3;
  uv_buf_t uVar4;
  code *pcStack_80;
  uv_buf_t local_78 [5];
  
  if (pinger->vectored_writes == 0) {
    pcStack_80 = (code *)0x162131;
    local_78[0] = uv_buf_init(PING,5);
    nbufs = 1;
  }
  else {
    unaff_R14 = PING;
    lVar3 = 8;
    do {
      pcStack_80 = (code *)0x162103;
      uVar4 = uv_buf_init(unaff_R14,1);
      *(char **)((long)local_78 + lVar3 + -8) = uVar4.base;
      *(size_t *)((long)&local_78[0].base + lVar3) = uVar4.len;
      unaff_R14 = unaff_R14 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x58);
    nbufs = 5;
  }
  pcStack_80 = (code *)0x162149;
  req = (uv_write_t *)malloc(0xc0);
  handle = &pinger->stream;
  pcStack_80 = (code *)0x162164;
  iVar1 = uv_write(req,(uv_stream_t *)&handle->tcp,local_78,nbufs,pinger_after_write);
  if (iVar1 == 0) {
    pcStack_80 = (code *)0x162174;
    puts("PING");
    return;
  }
  pcStack_80 = alloc_cb;
  pinger_write_ping_cold_1();
  pcStack_80 = (code *)unaff_R14;
  pvVar2 = malloc((size_t)handle);
  *extraout_RDX = pvVar2;
  extraout_RDX[1] = handle;
  return;
}

Assistant:

static void pinger_write_ping(pinger_t* pinger) {
  uv_write_t *req;
  uv_buf_t bufs[sizeof PING - 1];
  int i, nbufs;

  if (!pinger->vectored_writes) {
    /* Write a single buffer. */
    nbufs = 1;
    bufs[0] = uv_buf_init(PING, sizeof PING - 1);
  } else {
    /* Write multiple buffers, each with one byte in them. */
    nbufs = sizeof PING - 1;
    for (i = 0; i < nbufs; i++) {
      bufs[i] = uv_buf_init(&PING[i], 1);
    }
  }

  req = malloc(sizeof(*req));
  if (uv_write(req,
               (uv_stream_t*) &pinger->stream.tcp,
               bufs,
               nbufs,
               pinger_after_write)) {
    FATAL("uv_write failed");
  }

  puts("PING");
}